

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O2

UINT8 device_start_okim6295(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  uint uVar2;
  DEV_DATA info;
  UINT8 UVar3;
  uint uVar4;
  long lVar5;
  
  info.chipInf = calloc(1,0x118);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    for (lVar5 = 0x20; lVar5 != 0xe0; lVar5 = lVar5 + 0x30) {
      oki_adpcm_init((oki_adpcm_state *)(lVar5 + (long)info.chipInf),(INT8 *)0x0,(INT16 *)0x0);
    }
    *(undefined2 *)&((DEV_DATA *)((long)info.chipInf + 0xe0))->chipInf = 0xffff;
    *(undefined4 *)((long)info.chipInf + 0xe4) = 0;
    *(undefined1 *)((long)info.chipInf + 0xea) = 0;
    *(undefined4 *)((long)info.chipInf + 0xeb) = 0;
    ((DEV_DATA *)((long)info.chipInf + 0x100))->chipInf = (void *)0x0;
    *(undefined4 *)((long)info.chipInf + 0xfc) = 0;
    UVar1 = cfg->clock;
    *(UINT32 *)&((DEV_DATA *)((long)info.chipInf + 0xf8))->chipInf = UVar1;
    UVar3 = cfg->flags;
    *(UINT8 *)((long)info.chipInf + 0xe9) = UVar3;
    ((DEV_DATA *)((long)info.chipInf + 0x108))->chipInf = (void *)0x0;
    *(UINT32 *)&((DEV_DATA *)((long)info.chipInf + 0xf0))->chipInf = UVar1;
    *(char *)((long)info.chipInf + 0xf4) = (char)UVar1;
    *(char *)((long)info.chipInf + 0xf5) = (char)(UVar1 >> 8);
    *(char *)((long)info.chipInf + 0xf6) = (char)(UVar1 >> 0x10);
    *(char *)((long)info.chipInf + 0xf7) = (char)(UVar1 >> 0x18);
    *(UINT8 *)&((DEV_DATA *)((long)info.chipInf + 0xe8))->chipInf = UVar3;
    uVar4 = 0x84;
    if (UVar3 == '\0') {
      uVar4 = 0xa5;
    }
    UVar3 = '\0';
    okim6295_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    uVar2 = *(uint *)((long)info.chipInf + 0xf0);
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = uVar2 / uVar4;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_okim6295(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6295_state *info;
	UINT32 divisor;
	int voicenum;

	info = (okim6295_state *)calloc(1, sizeof(okim6295_state));
	if (info == NULL)
		return 0xFF;

	for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++)
		oki_adpcm_init(&info->voice[voicenum].adpcm, NULL, NULL);

	info->command = -1;
	info->bank_offs = 0;
	info->nmk_mode = 0x00;
	memset(info->nmk_bank, 0x00, 4 * sizeof(UINT8));
	info->ROM = NULL;
	info->ROMSize = 0x00;

	info->initial_clock = cfg->clock;
	info->pin7_initial = cfg->flags;
	info->SmpRateFunc = NULL;

	info->master_clock = info->initial_clock;
	WriteLE32(info->clock_buffer, info->master_clock);
	info->pin7_state = info->pin7_initial;
	divisor = info->pin7_state ? 132 : 165;

	okim6295_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->master_clock / divisor, &devDef);
	return 0x00;
}